

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O2

SchnorrKeyPairDataStruct * __thiscall
cfd::js::api::json::SchnorrKeyPairData::ConvertToStruct
          (SchnorrKeyPairDataStruct *__return_storage_ptr__,SchnorrKeyPairData *this)

{
  SchnorrKeyPairDataStruct::SchnorrKeyPairDataStruct(__return_storage_ptr__);
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  __return_storage_ptr__->parity = this->parity_;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->privkey);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(__return_storage_ptr__->ignore_items)._M_t,&(this->ignore_items)._M_t);
  return __return_storage_ptr__;
}

Assistant:

SchnorrKeyPairDataStruct SchnorrKeyPairData::ConvertToStruct() const {  // NOLINT
  SchnorrKeyPairDataStruct result;
  result.pubkey = pubkey_;
  result.parity = parity_;
  result.privkey = privkey_;
  result.ignore_items = ignore_items;
  return result;
}